

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_overwrite_bool(void)

{
  byte bVar1;
  int iVar2;
  bson_t b;
  bson_iter_t iter;
  undefined1 auStack_180 [128];
  undefined1 local_100 [248];
  
  bson_init(auStack_180);
  bVar1 = bson_append_bool(auStack_180,"key",0xffffffff,1);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1df,"test_bson_iter_overwrite_bool","bson_append_bool (&b, \"key\", -1, true)");
    abort();
  }
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1e0,"test_bson_iter_overwrite_bool","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 8) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1e1,"test_bson_iter_overwrite_bool","BSON_ITER_HOLDS_BOOL (&iter)");
    abort();
  }
  bson_iter_overwrite_bool(local_100,0);
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1e3,"test_bson_iter_overwrite_bool","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 8) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1e4,"test_bson_iter_overwrite_bool","BSON_ITER_HOLDS_BOOL (&iter)");
    abort();
  }
  bVar1 = bson_iter_bool(local_100);
  if ((bVar1 & 1) != 0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)bson_iter_bool (&iter) == false\n",0x1e5);
    abort();
  }
  bson_destroy(auStack_180);
  return;
}

Assistant:

static void
test_bson_iter_overwrite_bool (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_bool (&b, "key", -1, true));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   bson_iter_overwrite_bool (&iter, false);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   BSON_ASSERT_CMPINT (bson_iter_bool (&iter), ==, false);
   bson_destroy (&b);
}